

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

_Bool rd_test_partition3(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
                        TokenExtra **tp,PC_TREE *pc_tree,RD_STATS *best_rdc,int64_t *this_rdcost,
                        PICK_MODE_CONTEXT **ctxs,int mi_row,int mi_col,BLOCK_SIZE bsize,
                        PARTITION_TYPE partition,BLOCK_SIZE *ab_subsize,int (*ab_mi_pos) [2],
                        MB_MODE_INFO **mode_cache)

{
  RD_STATS best_rdcost;
  int iVar1;
  TokenExtra **in_RCX;
  TileDataEnc *in_RDX;
  ThreadData_conflict *in_RSI;
  AV1_COMP *in_RDI;
  byte *in_R8;
  void *in_R9;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined8 unaff_retaddr;
  long *in_stack_00000008;
  undefined8 in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  BLOCK_SIZE in_stack_00000028;
  undefined7 in_stack_00000029;
  byte in_stack_00000030;
  PICK_MODE_CONTEXT *in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  int mode_search_success;
  int i;
  RD_STATS sum_rdc;
  int pl;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff14;
  int local_9c;
  RD_STATS local_98;
  int local_6c;
  MACROBLOCKD *local_68;
  ThreadData_conflict *local_60;
  void *local_58;
  _Bool local_21;
  
  local_68 = &(in_RSI->mb).e_mbd;
  local_60 = in_RSI;
  local_58 = in_R9;
  local_6c = partition_plane_context(local_68,in_stack_00000018,in_stack_00000020,in_stack_00000028)
  ;
  av1_init_rd_stats(&local_98);
  local_98.rate = (local_60->mb).mode_costs.partition_cost[local_6c][in_stack_00000030];
  local_98.rdcost = (long)local_98.rate * (long)(local_60->mb).rdmult + 0x100 >> 9;
  local_9c = 0;
  while( true ) {
    if (2 < local_9c) {
      av1_rd_cost_update(in_stack_ffffffffffffff14,
                         (RD_STATS *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      *in_stack_00000008 = local_98.rdcost;
      if (local_98.rdcost < *(long *)((long)local_58 + 0x10)) {
        local_98.rdcost =
             ((long)local_98.rate * (long)(local_60->mb).rdmult + 0x100 >> 9) + local_98.dist * 0x80
        ;
        *in_stack_00000008 = local_98.rdcost;
        if (local_98.rdcost < *(long *)((long)local_58 + 0x10)) {
          memcpy(local_58,&local_98,0x28);
          *in_R8 = in_stack_00000030;
          local_21 = true;
        }
        else {
          local_21 = false;
        }
      }
      else {
        local_21 = false;
      }
      return local_21;
    }
    if ((in_stack_00000048 != 0) && (*(long *)(in_stack_00000048 + (long)local_9c * 8) != 0)) {
      (local_60->mb).use_mb_mode_cache = 1;
      (local_60->mb).mb_mode_cache = *(MB_MODE_INFO **)(in_stack_00000048 + (long)local_9c * 8);
    }
    in_stack_ffffffffffffff08 = *(undefined4 *)(in_stack_00000040 + 4 + (long)local_9c * 8);
    best_rdcost.dist = (int64_t)in_stack_00000008;
    best_rdcost.rate = (int)unaff_retaddr;
    best_rdcost.zero_rate = (int)((ulong)unaff_retaddr >> 0x20);
    best_rdcost.rdcost = in_stack_00000010;
    best_rdcost.sse._0_4_ = in_stack_00000018;
    best_rdcost.sse._4_4_ = in_stack_0000001c;
    best_rdcost._32_4_ = in_stack_00000020;
    best_rdcost._36_4_ = in_stack_00000024;
    iVar1 = rd_try_subblock(in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
                            (int)unaff_R14,(BLOCK_SIZE)unaff_R15,best_rdcost,
                            (RD_STATS *)CONCAT71(in_stack_00000029,in_stack_00000028),
                            in_stack_00000030,in_stack_00000038);
    (local_60->mb).use_mb_mode_cache = 0;
    (local_60->mb).mb_mode_cache = (MB_MODE_INFO *)0x0;
    if (iVar1 == 0) break;
    local_9c = local_9c + 1;
  }
  return false;
}

Assistant:

static bool rd_test_partition3(AV1_COMP *const cpi, ThreadData *td,
                               TileDataEnc *tile_data, TokenExtra **tp,
                               PC_TREE *pc_tree, RD_STATS *best_rdc,
                               int64_t *this_rdcost,
                               PICK_MODE_CONTEXT *ctxs[SUB_PARTITIONS_AB],
                               int mi_row, int mi_col, BLOCK_SIZE bsize,
                               PARTITION_TYPE partition,
                               const BLOCK_SIZE ab_subsize[SUB_PARTITIONS_AB],
                               const int ab_mi_pos[SUB_PARTITIONS_AB][2],
                               const MB_MODE_INFO **mode_cache) {
  MACROBLOCK *const x = &td->mb;
  const MACROBLOCKD *const xd = &x->e_mbd;
  const int pl = partition_plane_context(xd, mi_row, mi_col, bsize);
  RD_STATS sum_rdc;
  av1_init_rd_stats(&sum_rdc);
  sum_rdc.rate = x->mode_costs.partition_cost[pl][partition];
  sum_rdc.rdcost = RDCOST(x->rdmult, sum_rdc.rate, 0);
  // Loop over sub-partitions in AB partition type.
  for (int i = 0; i < SUB_PARTITIONS_AB; i++) {
    if (mode_cache && mode_cache[i]) {
      x->use_mb_mode_cache = 1;
      x->mb_mode_cache = mode_cache[i];
    }
    const int mode_search_success =
        rd_try_subblock(cpi, td, tile_data, tp, i == SUB_PARTITIONS_AB - 1,
                        ab_mi_pos[i][0], ab_mi_pos[i][1], ab_subsize[i],
                        *best_rdc, &sum_rdc, partition, ctxs[i]);
    x->use_mb_mode_cache = 0;
    x->mb_mode_cache = NULL;
    if (!mode_search_success) {
      return false;
    }
  }

  av1_rd_cost_update(x->rdmult, &sum_rdc);
  *this_rdcost = sum_rdc.rdcost;
  if (sum_rdc.rdcost >= best_rdc->rdcost) return false;
  sum_rdc.rdcost = RDCOST(x->rdmult, sum_rdc.rate, sum_rdc.dist);
  *this_rdcost = sum_rdc.rdcost;
  if (sum_rdc.rdcost >= best_rdc->rdcost) return false;

  *best_rdc = sum_rdc;
  pc_tree->partitioning = partition;
  return true;
}